

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Visitor<wasm::HashStringifyWalker,_void>::visit
          (Visitor<wasm::HashStringifyWalker,_void> *this,Expression *curr)

{
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<wasm::HashStringifyWalker>::visit(Expression *) [SubType = wasm::HashStringifyWalker, ReturnType = void]"
                 );
  }
  if ((byte)(curr->_id - BlockId) < 0x5f) {
    HashStringifyWalker::visitExpression((HashStringifyWalker *)this,curr);
    return;
  }
  handle_unreachable("unexpected expression type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                     ,0x46);
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }